

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fPrimitiveRestartTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::PrimitiveRestartCase::renderWithoutRestart(PrimitiveRestartCase *this)

{
  IndexType IVar1;
  GLenum GVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int startNdx;
  
  GVar2 = glwGetError();
  glu::checkError(GVar2,"PrimitiveRestartCase::renderWithoutRestart() begin",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fPrimitiveRestartTests.cpp"
                  ,0x24a);
  IVar1 = this->m_indexType;
  if (IVar1 == INDEX_UNSIGNED_BYTE) {
    uVar5 = 0xff;
  }
  else if (IVar1 == INDEX_UNSIGNED_SHORT) {
    uVar5 = 0xffff;
  }
  else {
    uVar5 = -(uint)(IVar1 == INDEX_UNSIGNED_INT);
  }
  glwDisable(0x8d69);
  GVar2 = glwGetError();
  glu::checkError(GVar2,"Disable primitive restart",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fPrimitiveRestartTests.cpp"
                  ,0x254);
  glwClear(0x4500);
  GVar2 = glwGetError();
  glu::checkError(GVar2,"Clear in PrimitiveRestartCase::renderWithoutRestart()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fPrimitiveRestartTests.cpp"
                  ,0x256);
  iVar3 = getNumIndices(this);
  if (-1 < iVar3) {
    iVar6 = 0;
    startNdx = 0;
    do {
      if (iVar6 < iVar3) {
        IVar1 = this->m_indexType;
        if (IVar1 == INDEX_UNSIGNED_INT) {
          uVar4 = (this->m_indicesUI).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar6];
        }
        else if (IVar1 == INDEX_UNSIGNED_SHORT) {
          uVar4 = (uint)(this->m_indicesUS).
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_start[iVar6];
        }
        else {
          uVar4 = 0;
          if (IVar1 == INDEX_UNSIGNED_BYTE) {
            uVar4 = (uint)(this->m_indicesUB).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start[iVar6];
          }
        }
        if (uVar4 == uVar5) goto LAB_01196845;
      }
      else {
LAB_01196845:
        if (startNdx < iVar3) {
          draw(this,startNdx,iVar6 - startNdx);
          GVar2 = glwGetError();
          glu::checkError(GVar2,"Draw in PrimitiveRestartCase::renderWithoutRestart()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fPrimitiveRestartTests.cpp"
                          ,0x269);
        }
        startNdx = iVar6 + 1;
      }
      iVar6 = iVar6 + 1;
    } while (iVar6 <= iVar3);
  }
  GVar2 = glwGetError();
  glu::checkError(GVar2,"PrimitiveRestartCase::renderWithoutRestart() end",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fPrimitiveRestartTests.cpp"
                  ,0x270);
  return;
}

Assistant:

void PrimitiveRestartCase::renderWithoutRestart (void)
{
	GLU_CHECK_MSG("PrimitiveRestartCase::renderWithoutRestart() begin");

	deUint32 restartIndex = m_indexType == INDEX_UNSIGNED_BYTE	? RESTART_INDEX_UNSIGNED_BYTE
						  : m_indexType == INDEX_UNSIGNED_SHORT	? RESTART_INDEX_UNSIGNED_SHORT
						  : m_indexType == INDEX_UNSIGNED_INT	? RESTART_INDEX_UNSIGNED_INT
						  : 0;

	DE_ASSERT(restartIndex != 0);

	glDisable(GL_PRIMITIVE_RESTART_FIXED_INDEX);
	GLU_CHECK_MSG("Disable primitive restart");
	glClear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);
	GLU_CHECK_MSG("Clear in PrimitiveRestartCase::renderWithoutRestart()");

	// Draw, emulating primitive restart.

	int numIndices = getNumIndices();

	DE_ASSERT(numIndices >= 0);

	int indexArrayStartNdx = 0; // Keep track of the draw start index - first index after a primitive restart, or initially the first index altogether.

	for (int indexArrayNdx = 0; indexArrayNdx <= numIndices; indexArrayNdx++) // \note Goes one "too far" in order to detect end of array as well.
	{
		if (indexArrayNdx >= numIndices || getIndex(indexArrayNdx) == restartIndex) // \note Handle end of array the same way as a restart index encounter.
		{
			if (indexArrayStartNdx < numIndices)
			{
				// Draw from index indexArrayStartNdx to index indexArrayNdx-1 .

				draw(indexArrayStartNdx, indexArrayNdx - indexArrayStartNdx);
				GLU_CHECK_MSG("Draw in PrimitiveRestartCase::renderWithoutRestart()");
			}

			indexArrayStartNdx = indexArrayNdx + 1; // Next draw starts just after this restart index.
		}
	}

	GLU_CHECK_MSG("PrimitiveRestartCase::renderWithoutRestart() end");
}